

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

Node * __thiscall
TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::NewKey
          (TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>
           *this,FName *key)

{
  char *pcVar1;
  undefined4 uVar2;
  FName FVar3;
  undefined4 uVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  FName local_14;
  
  uVar10 = key->Index;
  pNVar7 = this->Nodes;
  uVar11 = this->Size - 1;
  uVar12 = uVar11 & uVar10;
  pNVar5 = pNVar7 + uVar12;
  pNVar6 = pNVar7[uVar12].Next;
  if (pNVar6 != (Node *)0x1) {
    pNVar9 = this->LastFree;
    do {
      pNVar8 = pNVar9;
      pNVar9 = pNVar8 + -1;
      if (pNVar8 <= pNVar7) {
        this->LastFree = pNVar9;
        Resize(this,this->Size * 2);
        pNVar5 = NewKey(this,&local_14);
        return pNVar5;
      }
    } while (pNVar9->Next != (Node *)0x1);
    this->LastFree = pNVar9;
    uVar11 = uVar11 & (pNVar5->Pair).Key.Index;
    if (uVar11 == uVar12) {
      pNVar9->Next = pNVar6;
      pNVar7 = pNVar9;
      goto LAB_002f86ba;
    }
    pNVar7 = pNVar7 + uVar11;
    do {
      pNVar6 = pNVar7;
      pNVar7 = pNVar6->Next;
    } while (pNVar7 != pNVar5);
    pNVar6->Next = pNVar9;
    pNVar7 = pNVar5->Next;
    FVar3.Index = (pNVar5->Pair).Key.Index;
    uVar4 = *(undefined4 *)&(pNVar5->Pair).field_0x4;
    uVar2 = *(undefined4 *)&(pNVar5->Pair).Value.field_0x4;
    pcVar1 = (pNVar5->Pair).Value.args.Chars;
    pNVar8[-1].Pair.Value.device = (pNVar5->Pair).Value.device;
    *(undefined4 *)&pNVar8[-1].Pair.Value.field_0x4 = uVar2;
    pNVar8[-1].Pair.Value.args.Chars = pcVar1;
    pNVar9->Next = pNVar7;
    pNVar8[-1].Pair.Key = (FName)FVar3.Index;
    *(undefined4 *)&pNVar8[-1].Pair.field_0x4 = uVar4;
    uVar10 = key->Index;
  }
  pNVar9 = (Node *)0x0;
  pNVar7 = pNVar5;
LAB_002f86ba:
  pNVar5->Next = pNVar9;
  this->NumUsed = this->NumUsed + 1;
  (pNVar7->Pair).Key.Index = uVar10;
  return pNVar7;
}

Assistant:

Node *NewKey(const KT key)
	{
		Node *mp = MainPosition(key);
		if (!mp->IsNil())
		{
			Node *othern;
			Node *n = GetFreePos();		/* get a free place */
			if (n == NULL)				/* cannot find a free place? */
			{
				Rehash();				/* grow table */
				return NewKey(key);		/* re-insert key into grown table */
			}
			othern = MainPosition(mp->Pair.Key);
			if (othern != mp)			/* is colliding node out of its main position? */
			{	/* yes; move colliding node into free position */
				while (othern->Next != mp)	/* find previous */
				{
					othern = othern->Next;
				}
				othern->Next = n;		/* redo the chain with 'n' in place of 'mp' */
				CopyNode(n, mp); /* copy colliding node into free pos. (mp->Next also goes) */
				mp->Next = NULL;		/* now 'mp' is free */
			}
			else						/* colliding node is in its own main position */
			{							/* new node will go into free position */
				n->Next = mp->Next;		/* chain new position */
				mp->Next = n;
				mp = n;
			}
		}
		else
		{
			mp->Next = NULL;
		}
		++NumUsed;
		::new(&mp->Pair.Key) KT(key);
		return mp;
	}